

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadResourcesTest<vkt::api::(anonymous_namespace)::BufferView>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  long *plVar1;
  undefined8 uVar2;
  pointer pSVar3;
  deUint32 dVar4;
  Resources *this;
  long *plVar5;
  int *piVar6;
  ThreadGroupThread *this_00;
  uint uVar7;
  allocator_type *__a;
  long lVar8;
  size_type __n;
  Environment env;
  ThreadGroup threads;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_c8;
  long local_b8;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
  local_b0;
  Environment local_98;
  ThreadGroup local_60;
  
  dVar4 = deGetNumAvailableLogicalCores();
  uVar7 = 8;
  if (dVar4 < 8) {
    uVar7 = dVar4;
  }
  __n = 2;
  if (2 < uVar7) {
    __n = (size_type)uVar7;
  }
  local_98.vkp = context->m_platformInterface;
  local_98.vkd = Context::getDeviceInterface(context);
  local_98.device = Context::getDevice(context);
  local_98.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_98.programBinaries = context->m_progCollection;
  local_98.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_98.maxResourceConsumers = 1;
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
  ::vector(&local_b0,__n,__a);
  ThreadGroup::ThreadGroup(&local_60);
  local_b8 = __n << 4;
  lVar8 = 0;
  do {
    this = (Resources *)operator_new(0x50);
    BufferView::Resources::Resources(this,&local_98,(Parameters *)params.buffer.size);
    plVar5 = (long *)operator_new(0x20);
    pSVar3 = local_b0.
             super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)(plVar5 + 1) = 0;
    *(undefined4 *)((long)plVar5 + 0xc) = 0;
    *plVar5 = (long)&PTR__SharedPtrState_00d23ae0;
    plVar5[2] = (long)this;
    *(undefined4 *)(plVar5 + 1) = 1;
    *(undefined4 *)((long)plVar5 + 0xc) = 1;
    plVar1 = *(long **)((long)&(local_b0.
                                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_state + lVar8);
    if (plVar1 != plVar5) {
      if (plVar1 != (long *)0x0) {
        LOCK();
        plVar1 = plVar1 + 1;
        *(int *)plVar1 = (int)*plVar1 + -1;
        UNLOCK();
        if ((int)*plVar1 == 0) {
          *(undefined8 *)
           ((long)&(local_b0.
                    super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar8) = 0;
          (**(code **)(**(long **)((long)&(local_b0.
                                           super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                  lVar8) + 0x10))();
        }
        LOCK();
        piVar6 = (int *)(*(long *)((long)&pSVar3->m_state + lVar8) + 0xc);
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          plVar1 = *(long **)((long)&pSVar3->m_state + lVar8);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 8))();
          }
          *(undefined8 *)((long)&pSVar3->m_state + lVar8) = 0;
        }
      }
      *(Resources **)((long)&pSVar3->m_ptr + lVar8) = this;
      *(long **)((long)&pSVar3->m_state + lVar8) = plVar5;
      LOCK();
      *(int *)(plVar5 + 1) = (int)plVar5[1] + 1;
      UNLOCK();
      LOCK();
      piVar6 = (int *)(*(long *)((long)&pSVar3->m_state + lVar8) + 0xc);
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    plVar1 = plVar5 + 1;
    LOCK();
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar5 + 0x10))(plVar5);
    }
    piVar6 = (int *)((long)plVar5 + 0xc);
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      (**(code **)(*plVar5 + 8))(plVar5);
    }
    this_00 = (ThreadGroupThread *)operator_new(0x88);
    uVar2 = *(undefined8 *)
             ((long)&(local_b0.
                      super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar8);
    ThreadGroupThread::ThreadGroupThread(this_00);
    (this_00->super_Thread)._vptr_Thread = (_func_int **)&PTR__ThreadGroupThread_00d23b20;
    this_00[1].super_Thread._vptr_Thread = (_func_int **)&local_98;
    *(undefined8 *)&this_00[1].super_Thread.m_attribs = uVar2;
    this_00[1].super_Thread.m_thread = (deThread)&params;
    local_c8.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = this_00;
    ThreadGroup::add(&local_60,&local_c8);
    if (local_c8.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (ThreadGroupThread *)0x0) {
      (*((local_c8.
          super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
          .m_data.ptr)->super_Thread)._vptr_Thread[1])();
      local_c8.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
    lVar8 = lVar8 + 0x10;
  } while (local_b8 != lVar8);
  ThreadGroup::run(__return_storage_ptr__,&local_60);
  de::SpinBarrier::~SpinBarrier(&local_60.m_barrier);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
  ::~vector(&local_60.m_threads);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
  ::~vector(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadResourcesTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32		numThreads	= getDefaultTestThreadCount();
	const Environment	env			(context, 1u);
	vector<ResPtr>		resources	(numThreads);
	ThreadGroup			threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		resources[ndx] = ResPtr(new typename Object::Resources(env, params));
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, *resources[ndx], params)));
	}

	return threads.run();
}